

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void cftrec4(int n,double *a,int nw,double *w)

{
  bool bVar1;
  int isplt;
  int k;
  uint n_00;
  int j;
  int iVar3;
  uint uVar2;
  
  n_00 = n;
  uVar2 = n;
  if (0x200 < n) {
    do {
      n_00 = uVar2 >> 2;
      cftmdl1(n_00,a + (int)(n - n_00),w + (int)(nw - (uVar2 >> 3)));
      bVar1 = 0x803 < uVar2;
      uVar2 = n_00;
    } while (bVar1);
  }
  j = n - n_00;
  k = 1;
  cftleaf(n_00,1,a + j,nw,w);
  if (0 < j) {
    iVar3 = n + n_00 * -2;
    do {
      isplt = cfttree(n_00,j,k,a,nw,w);
      j = j - n_00;
      cftleaf(n_00,isplt,a + iVar3,nw,w);
      k = k + 1;
      iVar3 = iVar3 - n_00;
    } while (0 < j);
  }
  return;
}

Assistant:

void cftrec4(int n, double *a, int nw, double *w) {
  int cfttree(int n, int j, int k, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftmdl1(int n, double *a, double *w);
  int isplt, j, k, m;

  m = n;
  while (m > 512) {
    m >>= 2;
    cftmdl1(m, &a[n - m], &w[nw - (m >> 1)]);
  }
  cftleaf(m, 1, &a[n - m], nw, w);
  k = 0;
  for (j = n - m; j > 0; j -= m) {
    k++;
    isplt = cfttree(m, j, k, a, nw, w);
    cftleaf(m, isplt, &a[j - m], nw, w);
  }
}